

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool medit_desc(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  
  cVar1 = *argument;
  if (cVar1 == '\0') {
    string_append(ch,(char **)((long)ch->desc->pEdit + 0x70));
  }
  else {
    send_to_char("Syntax:  desc    - line edit\n\r",ch);
  }
  return cVar1 == '\0';
}

Assistant:

bool medit_desc(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		string_append(ch, &pMob->description);
		return true;
	}

	send_to_char("Syntax:  desc    - line edit\n\r", ch);
	return false;
}